

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_long,double>
          (Thread *this,BinopFunc<unsigned_long,_double> *f)

{
  unsigned_long uVar1;
  u8 i;
  long lVar2;
  Simd<double,_(unsigned_char)__x02_> SVar3;
  SR result;
  Simd<double,_(unsigned_char)__x02_> lhs;
  Simd<double,_(unsigned_char)__x02_> rhs;
  Value local_48;
  double local_38 [2];
  double local_28 [2];
  
  local_28 = (double  [2])Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  SVar3 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    uVar1 = (*f)(local_38[lVar2],local_28[lVar2]);
    *(unsigned_long *)((long)&local_48 + lVar2 * 8) = uVar1;
  }
  Push(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}